

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

istream * Json::operator>>(istream *sin,Value *root)

{
  bool bVar1;
  runtime_error *this;
  Reader reader;
  string sStack_148;
  Reader local_128;
  
  Reader::Reader(&local_128);
  bVar1 = Reader::parse(&local_128,sin,root,true);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.commentsBefore_._M_dataplus._M_p != &local_128.commentsBefore_.field_2) {
      operator_delete(local_128.commentsBefore_._M_dataplus._M_p,
                      local_128.commentsBefore_.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.document_._M_dataplus._M_p != &local_128.document_.field_2) {
      operator_delete(local_128.document_._M_dataplus._M_p,
                      local_128.document_.field_2._M_allocated_capacity + 1);
    }
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::~deque
              (&local_128.errors_);
    std::_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>::~_Deque_base
              ((_Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_> *)&local_128);
    return sin;
  }
  Reader::getFormattedErrorMessages_abi_cxx11_(&sStack_148,&local_128);
  operator>>();
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"reader error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::istream& operator>>(std::istream& sin, Value& root) {
  Json::Reader reader;
  bool ok = reader.parse(sin, root, true);
  if (!ok) {
    fprintf(stderr,
            "Error from reader: %s",
            reader.getFormattedErrorMessages().c_str());

    JSON_FAIL_MESSAGE("reader error");
  }
  return sin;
}